

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall
CConnman::SocketHandlerConnected
          (CConnman *this,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          EventsPerSock *events_per_sock)

{
  int err;
  pointer ppCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int *p_Var4;
  undefined1 *puVar5;
  bool bVar6;
  uint uVar7;
  const_iterator cVar8;
  int *piVar9;
  Logger *pLVar10;
  byte bVar11;
  undefined1 *puVar12;
  byte bVar13;
  byte bVar14;
  CNode *pCVar15;
  pointer ppCVar16;
  int iVar17;
  long in_FS_OFFSET;
  Span<const_unsigned_char> msg_bytes;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  pair<unsigned_long,_bool> pVar18;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock69;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock67;
  
  puVar5 = &stack0xffffffffffffffd0;
  do {
    puVar12 = puVar5;
    *(undefined8 *)(puVar12 + -0x1000) = 0;
    puVar5 = puVar12 + -0x1000;
  } while ((bool *)(puVar12 + -0x1000) != &criticalblock67.super_unique_lock._M_owns);
  *(EventsPerSock **)(puVar12 + -0x1050) = events_per_sock;
  *(CConnman **)(puVar12 + -0x1058) = this;
  *(undefined8 *)(puVar12 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ppCVar16 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppCVar1 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  *(pointer *)(puVar12 + -0x1038) = ppCVar1;
  if (ppCVar16 != ppCVar1) {
    *(long *)(puVar12 + -0x1040) = *(long *)(puVar12 + -0x1058) + 0x308;
    do {
      pCVar15 = *ppCVar16;
      *(undefined8 *)(puVar12 + -0x1070) = 0x8d9201;
      bVar6 = CThreadInterrupt::operator_cast_to_bool(*(CThreadInterrupt **)(puVar12 + -0x1040));
      iVar17 = 1;
      if (!bVar6) {
        *(Mutex **)(puVar12 + -0x1008) = &pCVar15->m_sock_mutex;
        puVar12[-0x1000] = 0;
        *(undefined8 *)(puVar12 + -0x1070) = 0x8d922a;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(puVar12 + -0x1008));
        peVar2 = (pCVar15->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(CNode **)(puVar12 + -0x1060) = pCVar15;
        *(Mutex **)(puVar12 + -0x1048) = &pCVar15->m_sock_mutex;
        if (peVar2 == (element_type *)0x0) {
          iVar17 = 3;
LAB_008d92ae:
          bVar14 = 0;
          bVar11 = 0;
          bVar13 = 0;
        }
        else {
          *(element_type **)(puVar12 + -0x1028) = peVar2;
          p_Var3 = (pCVar15->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020) = p_Var3;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          *(undefined8 *)(puVar12 + -0x1070) = 0x8d927c;
          cVar8 = std::
                  _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(*(_Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           **)(puVar12 + -0x1050),(key_type *)(puVar12 + -0x1028));
          if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            *(undefined8 *)(puVar12 + -0x1070) = 0x8d928e;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar12 + -0x1020));
          }
          iVar17 = 0;
          if (cVar8.
              super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_008d92ae;
          bVar13 = *(byte *)((long)cVar8.
                                   super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                                   ._M_cur + 0x19);
          bVar11 = (bVar13 & 2) >> 1;
          bVar14 = (bVar13 & 4) >> 2;
        }
        *(undefined8 *)(puVar12 + -0x1070) = 0x8d92bf;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(puVar12 + -0x1008));
        pCVar15 = *(CNode **)(puVar12 + -0x1060);
        if (peVar2 != (element_type *)0x0) {
          if (bVar11 != 0) {
            *(Mutex **)(puVar12 + -0x1008) = &pCVar15->cs_vSend;
            puVar12[-0x1000] = 0;
            *(undefined8 *)(puVar12 + -0x1070) = 0x8d92ec;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(puVar12 + -0x1008));
            *(undefined8 *)(puVar12 + -0x1070) = 0x8d92f9;
            pVar18 = SocketSendData(*(CConnman **)(puVar12 + -0x1058),pCVar15);
            *(undefined8 *)(puVar12 + -0x1070) = 0x8d9308;
            std::unique_lock<std::mutex>::~unique_lock
                      ((unique_lock<std::mutex> *)(puVar12 + -0x1008));
            if (pVar18.first != 0) {
              *(undefined8 *)(puVar12 + -0x1070) = 0x8d931a;
              RecordBytesSent(*(CConnman **)(puVar12 + -0x1058),pVar18.first);
              if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                bVar13 = 0;
              }
            }
            pCVar15 = *(CNode **)(puVar12 + -0x1060);
          }
          if ((bVar13 & 1) != 0 || bVar14 != 0) {
            *(undefined8 *)(puVar12 + -0x1028) = *(undefined8 *)(puVar12 + -0x1048);
            puVar12[-0x1020] = 0;
            *(undefined8 *)(puVar12 + -0x1070) = 0x8d9354;
            std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(puVar12 + -0x1028));
            peVar2 = (pCVar15->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            if (peVar2 == (element_type *)0x0) {
              iVar17 = 3;
              uVar7 = 0;
            }
            else {
              p_Var4 = peVar2->_vptr_Sock[4];
              *(undefined8 *)(puVar12 + -0x1070) = 0x8d9376;
              uVar7 = (*p_Var4)(peVar2,puVar12 + -0x1008,0x10000,0x40);
              iVar17 = 0;
            }
            *(undefined8 *)(puVar12 + -0x1070) = 0x8d9390;
            std::unique_lock<std::mutex>::~unique_lock
                      ((unique_lock<std::mutex> *)(puVar12 + -0x1028));
            pCVar15 = *(CNode **)(puVar12 + -0x1060);
            if (peVar2 != (element_type *)0x0) {
              if ((int)uVar7 < 1) {
                if (uVar7 != 0) {
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d93fd;
                  piVar9 = __errno_location();
                  err = *piVar9;
                  iVar17 = 0;
                  if (err < 0x5a) {
                    if ((err == 4) || (err == 0xb)) {
LAB_008d94f5:
                      pCVar15 = *(CNode **)(puVar12 + -0x1060);
                      goto LAB_008d94a4;
                    }
                  }
                  else if ((err == 0x5a) || (err == 0x73)) goto LAB_008d94f5;
                  if ((*(byte *)(*(long *)(puVar12 + -0x1060) + 0x21a) & 1) == 0) {
                    *(undefined8 *)(puVar12 + -0x1070) = 0x8d9514;
                    pLVar10 = LogInstance();
                    *(undefined8 *)(puVar12 + -0x1070) = 0x8d9526;
                    bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
                    if (bVar6) {
                      *(undefined8 *)(puVar12 + -0x1030) =
                           *(undefined8 *)(*(long *)(puVar12 + -0x1060) + 0x270);
                      *(undefined8 *)(puVar12 + -0x1070) = 0x8d954b;
                      NetworkErrorString_abi_cxx11_((string *)(puVar12 + -0x1028),err);
                      *(string **)(puVar12 + -0x1070) = (string *)(puVar12 + -0x1028);
                      *(undefined1 **)(puVar12 + -0x1078) = puVar12 + -0x1030;
                      *(char **)(puVar12 + -0x1080) = "socket recv error for peer=%d: %s\n";
                      *(undefined8 *)(puVar12 + -0x1088) = 1;
                      *(undefined8 *)(puVar12 + -0x1090) = 0x8d9585;
                      source_file_00._M_str =
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                      ;
                      source_file_00._M_len = 0x50;
                      logging_function_00._M_str = "SocketHandlerConnected";
                      logging_function_00._M_len = 0x16;
                      LogPrintf_<long,std::__cxx11::string>
                                (logging_function_00,source_file_00,0x85a,NET,
                                 *(Level *)(puVar12 + -0x1088),*(char **)(puVar12 + -0x1080),
                                 *(long **)(puVar12 + -0x1078),
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(puVar12 + -0x1070));
                      if (*(undefined1 **)(puVar12 + -0x1028) != puVar12 + -0x1018) {
                        *(undefined8 *)(puVar12 + -0x1070) = 0x8d95a5;
                        operator_delete(*(undefined1 **)(puVar12 + -0x1028),
                                        *(long *)(puVar12 + -0x1018) + 1);
                      }
                    }
                  }
                  pCVar15 = *(CNode **)(puVar12 + -0x1060);
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d95b2;
                  CNode::CloseSocketDisconnect(pCVar15);
                  goto LAB_008d94a4;
                }
                if (((pCVar15->fDisconnect)._M_base._M_i & 1U) == 0) {
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d9436;
                  pLVar10 = LogInstance();
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d9448;
                  bVar6 = BCLog::Logger::WillLogCategoryLevel(pLVar10,NET,Debug);
                  if (bVar6) {
                    *(NodeId *)(puVar12 + -0x1028) = pCVar15->id;
                    *(undefined1 **)(puVar12 + -0x1078) = puVar12 + -0x1028;
                    *(char **)(puVar12 + -0x1080) = "socket closed for peer=%d\n";
                    *(undefined8 *)(puVar12 + -0x1088) = 1;
                    *(undefined8 *)(puVar12 + -0x1090) = 0x8d9495;
                    source_file._M_str =
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                    ;
                    source_file._M_len = 0x50;
                    logging_function._M_str = "SocketHandlerConnected";
                    logging_function._M_len = 0x16;
                    LogPrintf_<long>(logging_function,source_file,0x84f,NET,
                                     *(Level *)(puVar12 + -0x1088),*(char **)(puVar12 + -0x1080),
                                     *(long **)(puVar12 + -0x1078));
                  }
                }
                *(undefined8 *)(puVar12 + -0x1070) = 0x8d94a1;
                CNode::CloseSocketDisconnect(pCVar15);
              }
              else {
                puVar12[-0x1028] = 0;
                *(undefined8 *)(puVar12 + -0x1070) = 0x8d93be;
                msg_bytes.m_size._0_4_ = uVar7;
                msg_bytes.m_data = puVar12 + -0x1008;
                msg_bytes.m_size._4_4_ = 0;
                bVar6 = CNode::ReceiveMsgBytes(pCVar15,msg_bytes,(bool *)(puVar12 + -0x1028));
                if (!bVar6) {
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d93ca;
                  CNode::CloseSocketDisconnect(pCVar15);
                }
                LOCK();
                *(long *)(*(long *)(puVar12 + -0x1058) + 0x28) =
                     *(long *)(*(long *)(puVar12 + -0x1058) + 0x28) + (ulong)uVar7;
                UNLOCK();
                if (puVar12[-0x1028] == '\x01') {
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d93e7;
                  CNode::MarkReceivedMsgsForProcessing(pCVar15);
                  *(undefined8 *)(puVar12 + -0x1070) = 0x8d93f1;
                  WakeMessageHandler(*(CConnman **)(puVar12 + -0x1058));
                }
              }
              iVar17 = 0;
            }
LAB_008d94a4:
            if (iVar17 != 0) goto LAB_008d94c6;
          }
          *(undefined8 *)(puVar12 + -0x1070) = 0x8d94b6;
          bVar6 = InactivityCheck(*(CConnman **)(puVar12 + -0x1058),pCVar15);
          iVar17 = 0;
          if (bVar6) {
            LOCK();
            (pCVar15->fDisconnect)._M_base._M_i = true;
            UNLOCK();
          }
        }
      }
LAB_008d94c6:
    } while (((iVar17 == 3) || (iVar17 == 0)) &&
            (ppCVar16 = ppCVar16 + 1, ppCVar16 != *(pointer *)(puVar12 + -0x1038)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar12 + 0xeff8)) {
    *(code **)(puVar12 + -0x1070) = SocketHandlerListening;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandlerConnected(const std::vector<CNode*>& nodes,
                                      const Sock::EventsPerSock& events_per_sock)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    for (CNode* pnode : nodes) {
        if (interruptNet)
            return;

        //
        // Receive
        //
        bool recvSet = false;
        bool sendSet = false;
        bool errorSet = false;
        {
            LOCK(pnode->m_sock_mutex);
            if (!pnode->m_sock) {
                continue;
            }
            const auto it = events_per_sock.find(pnode->m_sock);
            if (it != events_per_sock.end()) {
                recvSet = it->second.occurred & Sock::RECV;
                sendSet = it->second.occurred & Sock::SEND;
                errorSet = it->second.occurred & Sock::ERR;
            }
        }

        if (sendSet) {
            // Send data
            auto [bytes_sent, data_left] = WITH_LOCK(pnode->cs_vSend, return SocketSendData(*pnode));
            if (bytes_sent) {
                RecordBytesSent(bytes_sent);

                // If both receiving and (non-optimistic) sending were possible, we first attempt
                // sending. If that succeeds, but does not fully drain the send queue, do not
                // attempt to receive. This avoids needlessly queueing data if the remote peer
                // is slow at receiving data, by means of TCP flow control. We only do this when
                // sending actually succeeded to make sure progress is always made; otherwise a
                // deadlock would be possible when both sides have data to send, but neither is
                // receiving.
                if (data_left) recvSet = false;
            }
        }

        if (recvSet || errorSet)
        {
            // typical socket buffer is 8K-64K
            uint8_t pchBuf[0x10000];
            int nBytes = 0;
            {
                LOCK(pnode->m_sock_mutex);
                if (!pnode->m_sock) {
                    continue;
                }
                nBytes = pnode->m_sock->Recv(pchBuf, sizeof(pchBuf), MSG_DONTWAIT);
            }
            if (nBytes > 0)
            {
                bool notify = false;
                if (!pnode->ReceiveMsgBytes({pchBuf, (size_t)nBytes}, notify)) {
                    pnode->CloseSocketDisconnect();
                }
                RecordBytesRecv(nBytes);
                if (notify) {
                    pnode->MarkReceivedMsgsForProcessing();
                    WakeMessageHandler();
                }
            }
            else if (nBytes == 0)
            {
                // socket closed gracefully
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "socket closed for peer=%d\n", pnode->GetId());
                }
                pnode->CloseSocketDisconnect();
            }
            else if (nBytes < 0)
            {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS)
                {
                    if (!pnode->fDisconnect) {
                        LogDebug(BCLog::NET, "socket recv error for peer=%d: %s\n", pnode->GetId(), NetworkErrorString(nErr));
                    }
                    pnode->CloseSocketDisconnect();
                }
            }
        }

        if (InactivityCheck(*pnode)) pnode->fDisconnect = true;
    }
}